

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall Buffer_copyout_some_Test::TestBody(Buffer_copyout_some_Test *this)

{
  bool bVar1;
  pointer pvVar2;
  char *pcVar3;
  pointer pvVar4;
  char *__first2;
  char *in_R9;
  AssertHelper local_288;
  Message local_280;
  size_t local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_3;
  Message local_258;
  size_t local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_2;
  Message local_230;
  size_t local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1f0;
  Message local_1e8;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_;
  string allstrs;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  size_t n_got;
  size_type n_expected;
  array<char,_128UL> array;
  size_t n_pages;
  size_t n_writable;
  size_t local_d8;
  size_t n_readable;
  BufferWithReadonlyStrings local;
  Buffer_copyout_some_Test *this_local;
  
  local.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)&n_readable);
  local_d8 = bfy_buffer_get_content_len((bfy_buffer *)&n_readable);
  n_pages = bfy_buffer_get_space_len((bfy_buffer *)&n_readable);
  array._M_elems._120_8_ =
       anon_unknown.dwarf_16b2d::buffer_count_pages((bfy_buffer *)&n_readable,0xffffffffffffffff);
  array._M_elems[0x68] = '\0';
  array._M_elems[0x69] = '\0';
  array._M_elems[0x6a] = '\0';
  array._M_elems[0x6b] = '\0';
  array._M_elems[0x6c] = '\0';
  array._M_elems[0x6d] = '\0';
  array._M_elems[0x6e] = '\0';
  array._M_elems[0x6f] = '\0';
  array._M_elems[0x70] = '\0';
  array._M_elems[0x71] = '\0';
  array._M_elems[0x72] = '\0';
  array._M_elems[0x73] = '\0';
  array._M_elems[0x74] = '\0';
  array._M_elems[0x75] = '\0';
  array._M_elems[0x76] = '\0';
  array._M_elems[0x77] = '\0';
  array._M_elems[0x58] = '\0';
  array._M_elems[0x59] = '\0';
  array._M_elems[0x5a] = '\0';
  array._M_elems[0x5b] = '\0';
  array._M_elems[0x5c] = '\0';
  array._M_elems[0x5d] = '\0';
  array._M_elems[0x5e] = '\0';
  array._M_elems[0x5f] = '\0';
  array._M_elems[0x60] = '\0';
  array._M_elems[0x61] = '\0';
  array._M_elems[0x62] = '\0';
  array._M_elems[99] = '\0';
  array._M_elems[100] = '\0';
  array._M_elems[0x65] = '\0';
  array._M_elems[0x66] = '\0';
  array._M_elems[0x67] = '\0';
  array._M_elems[0x48] = '\0';
  array._M_elems[0x49] = '\0';
  array._M_elems[0x4a] = '\0';
  array._M_elems[0x4b] = '\0';
  array._M_elems[0x4c] = '\0';
  array._M_elems[0x4d] = '\0';
  array._M_elems[0x4e] = '\0';
  array._M_elems[0x4f] = '\0';
  array._M_elems[0x50] = '\0';
  array._M_elems[0x51] = '\0';
  array._M_elems[0x52] = '\0';
  array._M_elems[0x53] = '\0';
  array._M_elems[0x54] = '\0';
  array._M_elems[0x55] = '\0';
  array._M_elems[0x56] = '\0';
  array._M_elems[0x57] = '\0';
  array._M_elems[0x38] = '\0';
  array._M_elems[0x39] = '\0';
  array._M_elems[0x3a] = '\0';
  array._M_elems[0x3b] = '\0';
  array._M_elems[0x3c] = '\0';
  array._M_elems[0x3d] = '\0';
  array._M_elems[0x3e] = '\0';
  array._M_elems[0x3f] = '\0';
  array._M_elems[0x40] = '\0';
  array._M_elems[0x41] = '\0';
  array._M_elems[0x42] = '\0';
  array._M_elems[0x43] = '\0';
  array._M_elems[0x44] = '\0';
  array._M_elems[0x45] = '\0';
  array._M_elems[0x46] = '\0';
  array._M_elems[0x47] = '\0';
  array._M_elems[0x28] = '\0';
  array._M_elems[0x29] = '\0';
  array._M_elems[0x2a] = '\0';
  array._M_elems[0x2b] = '\0';
  array._M_elems[0x2c] = '\0';
  array._M_elems[0x2d] = '\0';
  array._M_elems[0x2e] = '\0';
  array._M_elems[0x2f] = '\0';
  array._M_elems[0x30] = '\0';
  array._M_elems[0x31] = '\0';
  array._M_elems[0x32] = '\0';
  array._M_elems[0x33] = '\0';
  array._M_elems[0x34] = '\0';
  array._M_elems[0x35] = '\0';
  array._M_elems[0x36] = '\0';
  array._M_elems[0x37] = '\0';
  array._M_elems[0x18] = '\0';
  array._M_elems[0x19] = '\0';
  array._M_elems[0x1a] = '\0';
  array._M_elems[0x1b] = '\0';
  array._M_elems[0x1c] = '\0';
  array._M_elems[0x1d] = '\0';
  array._M_elems[0x1e] = '\0';
  array._M_elems[0x1f] = '\0';
  array._M_elems[0x20] = '\0';
  array._M_elems[0x21] = '\0';
  array._M_elems[0x22] = '\0';
  array._M_elems[0x23] = '\0';
  array._M_elems[0x24] = '\0';
  array._M_elems[0x25] = '\0';
  array._M_elems[0x26] = '\0';
  array._M_elems[0x27] = '\0';
  array._M_elems[8] = '\0';
  array._M_elems[9] = '\0';
  array._M_elems[10] = '\0';
  array._M_elems[0xb] = '\0';
  array._M_elems[0xc] = '\0';
  array._M_elems[0xd] = '\0';
  array._M_elems[0xe] = '\0';
  array._M_elems[0xf] = '\0';
  array._M_elems[0x10] = '\0';
  array._M_elems[0x11] = '\0';
  array._M_elems[0x12] = '\0';
  array._M_elems[0x13] = '\0';
  array._M_elems[0x14] = '\0';
  array._M_elems[0x15] = '\0';
  array._M_elems[0x16] = '\0';
  array._M_elems[0x17] = '\0';
  n_expected = 0;
  array._M_elems[0] = '\0';
  array._M_elems[1] = '\0';
  array._M_elems[2] = '\0';
  array._M_elems[3] = '\0';
  array._M_elems[4] = '\0';
  array._M_elems[5] = '\0';
  array._M_elems[6] = '\0';
  array._M_elems[7] = '\0';
  n_got = 0x1b;
  pvVar2 = std::data<std::array<char,128ul>>((array<char,_128UL> *)&n_expected);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )bfy_buffer_copyout((bfy_buffer *)&n_readable,0x1b,pvVar2);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_198,"n_expected","n_got",&n_got,(unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&allstrs.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x30e,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&allstrs.field_2 + 8),&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&allstrs.field_2 + 8));
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::__cxx11::string::string
            ((string *)&gtest_ar_.message_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &local.buf.changed_coalescing);
  pvVar2 = std::data<std::array<char,128ul>>((array<char,_128UL> *)&n_expected);
  pvVar4 = std::data<std::array<char,128ul>>((array<char,_128UL> *)&n_expected);
  pcVar3 = pvVar4 + (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
  __first2 = std::data<std::__cxx11::string>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_.message_);
  local_1d9 = std::equal<char*,char_const*>(pvVar2,pcVar3,__first2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_1d8,
               (AssertionResult *)
               "std::equal(std::data(array), std::data(array)+n_got, std::data(allstrs))","false",
               "true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x310,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_228 = bfy_buffer_get_content_len((bfy_buffer *)&n_readable);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_220,"n_readable","bfy_buffer_get_content_len(&local.buf)",&local_d8,
             &local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x313,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  local_250 = bfy_buffer_get_space_len((bfy_buffer *)&n_readable);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_248,"n_writable","bfy_buffer_get_space_len(&local.buf)",&n_pages,
             &local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x314,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  local_278 = anon_unknown.dwarf_16b2d::buffer_count_pages
                        ((bfy_buffer *)&n_readable,0xffffffffffffffff);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_270,"n_pages","buffer_count_pages(&local.buf)",
             (unsigned_long *)(array._M_elems + 0x78),&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x315,pcVar3);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)&n_readable);
  return;
}

Assistant:

TEST(Buffer, copyout_some) {
    auto local = BufferWithReadonlyStrings {};
    auto const n_readable = bfy_buffer_get_content_len(&local.buf);
    auto const n_writable = bfy_buffer_get_space_len(&local.buf);
    auto const n_pages = buffer_count_pages(&local.buf);

    // copy out some of it
    auto array = std::array<char, 128>{};
    auto constexpr n_expected = std::size(str1) + 1;
    auto const n_got = bfy_buffer_copyout(&local.buf, n_expected, std::data(array));

    // confirm we got what we expected
    EXPECT_EQ(n_expected, n_got);
    auto const allstrs = local.allstrs;
    EXPECT_TRUE(std::equal(std::data(array), std::data(array)+n_got, std::data(allstrs)));

    // confirm that buffer is unchanged
    EXPECT_EQ(n_readable, bfy_buffer_get_content_len(&local.buf));
    EXPECT_EQ(n_writable, bfy_buffer_get_space_len(&local.buf));
    EXPECT_EQ(n_pages, buffer_count_pages(&local.buf));
}